

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::BlendA64Mask1DTest8B>::TestInfo
::~TestInfo(TestInfo *this)

{
  std::__cxx11::string::~string((string *)&this->code_location);
  std::
  unique_ptr<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int)>_>_>_>
  ::~unique_ptr(&this->test_meta_factory);
  std::__cxx11::string::~string((string *)&this->test_base_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}